

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::readFrame(DumpReader *this,int whichFrame)

{
  int iVar1;
  uint whichFrame_00;
  SnapshotManager *pSVar2;
  undefined4 in_ESI;
  Vector3<double> *in_RDI;
  Thermo *in_stack_00000008;
  DumpReader *in_stack_00000030;
  Vector3d comw;
  Vector3d comvel;
  Vector3d com;
  Thermo thermo;
  int rbsl;
  int asl;
  Thermo *in_stack_00000138;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  Thermo local_20;
  byte bVar7;
  byte bVar8;
  undefined2 uVar9;
  
  if (((ulong)in_RDI[1].super_Vector<double,_3U>.data_[2] & 1) == 0) {
    scanFile(in_stack_00000030);
  }
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)(in_RDI->super_Vector<double,_3U>).data_[0]);
  iVar1 = SnapshotManager::getAtomStorageLayout(pSVar2);
  bVar7 = (byte)iVar1;
  bVar8 = (byte)((uint)iVar1 >> 8);
  uVar9 = (undefined2)((uint)iVar1 >> 0x10);
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)(in_RDI->super_Vector<double,_3U>).data_[0]);
  whichFrame_00 = SnapshotManager::getRigidBodyStorageLayout(pSVar2);
  uVar6 = (bVar7 & 1) != 0 || (whichFrame_00 & 1) != 0;
  *(byte *)(in_RDI[0x18].super_Vector<double,_3U>.data_ + 2) = -uVar6 & 1;
  uVar5 = (bVar7 & 2) != 0 || (whichFrame_00 & 2) != 0;
  *(byte *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x11) = -uVar5 & 1;
  uVar4 = true;
  if (((((bVar7 & 8) == 0) && (uVar4 = true, (bVar8 & 4) == 0)) && (uVar4 = true, (bVar8 & 8) == 0))
     && ((uVar4 = true, (whichFrame_00 & 8) == 0 && (uVar4 = true, (whichFrame_00 & 0x400) == 0))))
  {
    uVar4 = (whichFrame_00 & 0x800) != 0;
  }
  *(byte *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x12) = -uVar4 & 1;
  uVar3 = (bVar7 & 0x10) != 0 || (whichFrame_00 & 0x10) != 0;
  *(undefined1 *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x13) = uVar3;
  *(byte *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x15) = -((bVar8 >> 4 & 1) != 0) & 1
  ;
  readSet((DumpReader *)CONCAT44(in_ESI,CONCAT22(uVar9,CONCAT11(bVar8,bVar7))),whichFrame_00);
  if ((*(byte *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x14) & 1) != 0) {
    Thermo::Thermo(&local_20,(SimInfo *)(in_RDI->super_Vector<double,_3U>).data_[0]);
    Vector3<double>::Vector3((Vector3<double> *)0x14592b);
    if ((((ulong)in_RDI[0x18].super_Vector<double,_3U>.data_[2] & 1) == 0) ||
       ((*(byte *)((long)in_RDI[0x18].super_Vector<double,_3U>.data_ + 0x11) & 1) == 0)) {
      Thermo::getCom(in_stack_00000008);
      Vector3<double>::operator=
                (in_RDI,(Vector3<double> *)
                        CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_ffffffffffffff58)))));
    }
    else {
      Vector3<double>::Vector3((Vector3<double> *)0x145951);
      Vector3<double>::Vector3((Vector3<double> *)0x14595b);
      Thermo::getComAll((Thermo *)com.super_Vector<double,_3U>.data_[0],
                        (Vector3d *)comvel.super_Vector<double,_3U>.data_[2],
                        (Vector3d *)comvel.super_Vector<double,_3U>.data_[1]);
      Thermo::getAngularMomentum(in_stack_00000138);
      Vector3<double>::operator=
                (in_RDI,(Vector3<double> *)
                        CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,
                                                  in_stack_ffffffffffffff58)))));
    }
  }
  return;
}

Assistant:

void DumpReader::readFrame(int whichFrame) {
    if (!isScanned_) scanFile();

    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();

    needPos_ =
        (asl & DataStorage::dslPosition || rbsl & DataStorage::dslPosition) ?
            true :
            false;
    needVel_ =
        (asl & DataStorage::dslVelocity || rbsl & DataStorage::dslVelocity) ?
            true :
            false;
    needQuaternion_ =
        (asl & DataStorage::dslAmat || asl & DataStorage::dslDipole ||
         asl & DataStorage::dslQuadrupole || rbsl & DataStorage::dslAmat ||
         rbsl & DataStorage::dslDipole || rbsl & DataStorage::dslQuadrupole) ?
            true :
            false;
    needAngMom_ = (asl & DataStorage::dslAngularMomentum ||
                   rbsl & DataStorage::dslAngularMomentum) ?
                      true :
                      false;

    // some dump files contain the efield, but we should only parse
    // and set the field if we have actually allocated memory for it
    readField_ = (asl & DataStorage::dslElectricField) ? true : false;

    readSet(whichFrame);

    if (needCOMprops_) {
      Thermo thermo(info_);
      Vector3d com;

      if (needPos_ && needVel_) {
        Vector3d comvel;
        Vector3d comw;
        thermo.getComAll(com, comvel);
        comw = thermo.getAngularMomentum();
      } else {
        com = thermo.getCom();
      }
    }
  }